

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi_cache.cpp
# Opt level: O2

UBool __thiscall
icu_63::RuleBasedBreakIterator::DictionaryCache::following
          (DictionaryCache *this,int32_t fromPos,int32_t *result,int32_t *statusIndex)

{
  uint uVar1;
  int iVar2;
  int32_t *piVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  if ((fromPos < this->fLimit) && (this->fStart <= fromPos)) {
    uVar1 = (this->fBreaks).count;
    uVar5 = this->fPositionInCache;
    if (((int)uVar5 < (int)uVar1 && -1 < (int)uVar5) &&
       (piVar3 = (this->fBreaks).elements, piVar3[uVar5] == fromPos)) {
      uVar5 = uVar5 + 1;
      this->fPositionInCache = uVar5;
      if (uVar1 <= uVar5) goto LAB_0017f827;
      *result = piVar3[uVar5];
    }
    else {
      piVar3 = (this->fBreaks).elements;
      uVar6 = 0;
      uVar4 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar4 = uVar6;
      }
      do {
        this->fPositionInCache = (int32_t)uVar6;
        if (uVar4 == uVar6) goto LAB_0017f827;
        iVar2 = piVar3[uVar6];
        uVar6 = uVar6 + 1;
      } while (iVar2 <= fromPos);
      *result = iVar2;
    }
    *statusIndex = this->fOtherRuleStatusIndex;
    return '\x01';
  }
LAB_0017f827:
  this->fPositionInCache = -1;
  return '\0';
}

Assistant:

UBool RuleBasedBreakIterator::DictionaryCache::following(int32_t fromPos, int32_t *result, int32_t *statusIndex) {
    if (fromPos >= fLimit || fromPos < fStart) {
        fPositionInCache = -1;
        return FALSE;
    }

    // Sequential iteration, move from previous boundary to the following

    int32_t r = 0;
    if (fPositionInCache >= 0 && fPositionInCache < fBreaks.size() && fBreaks.elementAti(fPositionInCache) == fromPos) {
        ++fPositionInCache;
        if (fPositionInCache >= fBreaks.size()) {
            fPositionInCache = -1;
            return FALSE;
        }
        r = fBreaks.elementAti(fPositionInCache);
        U_ASSERT(r > fromPos);
        *result = r;
        *statusIndex = fOtherRuleStatusIndex;
        return TRUE;
    }

    // Random indexing. Linear search for the boundary following the given position.

    for (fPositionInCache = 0; fPositionInCache < fBreaks.size(); ++fPositionInCache) {
        r= fBreaks.elementAti(fPositionInCache);
        if (r > fromPos) {
            *result = r;
            *statusIndex = fOtherRuleStatusIndex;
            return TRUE;
        }
    }
    U_ASSERT(FALSE);
    fPositionInCache = -1;
    return FALSE;
}